

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

void __thiscall
Employee::Employee(Employee *this,Person *person,Address *address,Employee *employee)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Address local_80;
  
  Address::Address(&local_80,address);
  Person::Person(&this->super_Person,person,&local_80);
  Address::~Address(&local_80);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0011ed30;
  iVar1 = employee->salaryPerHour;
  iVar2 = employee->workToDo;
  iVar3 = employee->workDone;
  this->hourWork = employee->hourWork;
  this->salaryPerHour = iVar1;
  this->workToDo = iVar2;
  this->workDone = iVar3;
  return;
}

Assistant:

Employee::Employee(const Person &person, Address address, const Employee &employee) : Person(person, address) {

    this->hourWork = employee.hourWork;
    this->salaryPerHour = employee.salaryPerHour;
    this->workToDo = employee.workToDo;
    this->workDone = employee.workDone;

}